

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::CKeyPool::CKeyPool(CKeyPool *this,CPubKey *vchPubKeyIn,bool internalIn)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  int64_t iVar17;
  byte in_DL;
  undefined4 *in_RSI;
  CPubKey *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CPubKey::CPubKey(in_RDI);
  iVar17 = GetTime();
  *(int64_t *)in_RDI->vch = iVar17;
  in_RDI[1].vch[7] = *(uchar *)(in_RSI + 0x10);
  uVar2 = *in_RSI;
  uVar3 = in_RSI[1];
  uVar4 = in_RSI[2];
  uVar5 = in_RSI[3];
  uVar6 = in_RSI[4];
  uVar7 = in_RSI[5];
  uVar8 = in_RSI[6];
  uVar9 = in_RSI[7];
  uVar10 = in_RSI[8];
  uVar11 = in_RSI[9];
  uVar12 = in_RSI[10];
  uVar13 = in_RSI[0xb];
  uVar14 = in_RSI[0xd];
  uVar15 = in_RSI[0xe];
  uVar16 = in_RSI[0xf];
  *(undefined4 *)(in_RDI->vch + 0x38) = in_RSI[0xc];
  *(undefined4 *)(in_RDI->vch + 0x3c) = uVar14;
  *(undefined4 *)(in_RDI->vch + 0x40) = uVar15;
  *(undefined4 *)(in_RDI[1].vch + 3) = uVar16;
  *(undefined4 *)(in_RDI->vch + 0x28) = uVar10;
  *(undefined4 *)(in_RDI->vch + 0x2c) = uVar11;
  *(undefined4 *)(in_RDI->vch + 0x30) = uVar12;
  *(undefined4 *)(in_RDI->vch + 0x34) = uVar13;
  *(undefined4 *)(in_RDI->vch + 0x18) = uVar6;
  *(undefined4 *)(in_RDI->vch + 0x1c) = uVar7;
  *(undefined4 *)(in_RDI->vch + 0x20) = uVar8;
  *(undefined4 *)(in_RDI->vch + 0x24) = uVar9;
  *(undefined4 *)(in_RDI->vch + 8) = uVar2;
  *(undefined4 *)(in_RDI->vch + 0xc) = uVar3;
  *(undefined4 *)(in_RDI->vch + 0x10) = uVar4;
  *(undefined4 *)(in_RDI->vch + 0x14) = uVar5;
  in_RDI[1].vch[8] = in_DL & 1;
  in_RDI[1].vch[9] = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CKeyPool::CKeyPool(const CPubKey& vchPubKeyIn, bool internalIn)
{
    nTime = GetTime();
    vchPubKey = vchPubKeyIn;
    fInternal = internalIn;
    m_pre_split = false;
}